

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceGoniometric::~IfcLightSourceGoniometric
          (IfcLightSourceGoniometric *this)

{
  ~IfcLightSourceGoniometric((IfcLightSourceGoniometric *)&this[-1].super_IfcLightSource.field_0x80)
  ;
  return;
}

Assistant:

IfcLightSourceGoniometric() : Object("IfcLightSourceGoniometric") {}